

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int lua_checkmemory(lua_State *L)

{
  lu_mem lVar1;
  bool local_39;
  lu_mem local_38;
  lu_mem totalshould;
  lu_mem totalin;
  GCObject *pGStack_20;
  int maybedead;
  GCObject *o;
  global_State *g;
  lua_State *L_local;
  
  o = (GCObject *)L->l_G;
  g = (global_State *)L;
  if (((global_State *)o)->gcstate < 3) {
    if ((((global_State *)o)->mainthread->marked & 0x18) != 0) {
      __assert_fail("!(((g->mainthread)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x209,"int lua_checkmemory(lua_State *)");
    }
    if (((((global_State *)o)->l_registry).tt_ & 0x8000) == 0) {
      __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x20a,"int lua_checkmemory(lua_State *)");
    }
    if ((((((global_State *)o)->l_registry).value_.gc)->marked & 0x18) != 0) {
      __assert_fail("!((((((void) sizeof (((((&g->l_registry)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((&g->l_registry)->tt_) & (1 << 15))) ; else __assert_fail (\"(((&g->l_registry)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c\", 522, __extension__ __PRETTY_FUNCTION__); })), (((&g->l_registry)->value_).gc)))->marked) & (((1<<(3)) | (1<<(4)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x20a,"int lua_checkmemory(lua_State *)");
    }
  }
  if (((((global_State *)o)->l_registry).tt_ & 0x8000) == 0) {
    __assert_fail("(((&g->l_registry)->tt_) & (1 << 15))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x20c,"int lua_checkmemory(lua_State *)");
  }
  if ((((((global_State *)o)->l_registry).value_.gc)->marked &
      (((global_State *)o)->currentwhite ^ 0x18)) != 0) {
    __assert_fail("!((((((void) sizeof (((((&g->l_registry)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((&g->l_registry)->tt_) & (1 << 15))) ; else __assert_fail (\"(((&g->l_registry)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c\", 524, __extension__ __PRETTY_FUNCTION__); })), (((&g->l_registry)->value_).gc)))->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x20c,"int lua_checkmemory(lua_State *)");
  }
  if ((((global_State *)o)->sweepgc != (GCObject **)0x0) &&
     ((((global_State *)o)->gcstate < 3 || (6 < ((global_State *)o)->gcstate)))) {
    __assert_fail("g->sweepgc == ((void*)0) || (3 <= (g)->gcstate && (g)->gcstate <= 6)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x20d,"int lua_checkmemory(lua_State *)");
  }
  totalshould = checkgrays((global_State *)o);
  pGStack_20 = *(GCObject **)&o[10].tt;
  while( true ) {
    if (pGStack_20 == (GCObject *)0x0) {
      local_39 = false;
      if (2 < *(byte *)((long)&o[5].next + 5)) {
        local_39 = *(byte *)((long)&o[5].next + 5) < 4;
      }
      totalin._4_4_ = (uint)local_39;
      local_38 = checklist((global_State *)o,totalin._4_4_,0,o[6].next,o[0xb].next,
                           *(GCObject **)&o[0xb].tt,o[0xc].next);
      lVar1 = checklist((global_State *)o,0,1,o[7].next,o[0xd].next,*(GCObject **)&o[0xd].tt,
                        o[0xe].next);
      local_38 = lVar1 + local_38;
      pGStack_20 = o[10].next;
      while( true ) {
        if (pGStack_20 == (GCObject *)0x0) {
          if ((*(byte *)((long)&o[5].next + 5) < 3) && (totalshould != local_38)) {
            __assert_fail("totalin == totalshould",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x226,"int lua_checkmemory(lua_State *)");
          }
          return 0;
        }
        checkobject((global_State *)o,pGStack_20,0,0);
        incifingray((global_State *)o,pGStack_20,&local_38);
        if ((pGStack_20->marked & 0x40) == 0) {
          __assert_fail("(((o)->marked) & ((1<<(6))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x222,"int lua_checkmemory(lua_State *)");
        }
        if ((pGStack_20->tt != '\a') && (pGStack_20->tt != '\x05')) break;
        pGStack_20 = pGStack_20->next;
      }
      __assert_fail("o->tt == 7 || o->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x223,"int lua_checkmemory(lua_State *)");
    }
    if (((*(char *)((long)pGStack_20 + 8) != '\x04') ||
        ((*(byte *)((long)pGStack_20 + 9) & 0x38) != 0)) ||
       ((*(byte *)((long)pGStack_20 + 9) & 7) != 4)) break;
    pGStack_20 = pGStack_20->next;
  }
  __assert_fail("o->tt == ((4) | ((0) << 4)) && (!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5))))) && ((o)->marked & 7) == 4"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x212,"int lua_checkmemory(lua_State *)");
}

Assistant:

int lua_checkmemory (lua_State *L) {
  global_State *g = G(L);
  GCObject *o;
  int maybedead;
  lu_mem totalin;  /* total of objects that are in gray lists */
  lu_mem totalshould;  /* total of objects that should be in gray lists */
  if (keepinvariant(g)) {
    lua_assert(!iswhite(g->mainthread));
    lua_assert(!iswhite(gcvalue(&g->l_registry)));
  }
  lua_assert(!isdead(g, gcvalue(&g->l_registry)));
  lua_assert(g->sweepgc == NULL || issweepphase(g));
  totalin = checkgrays(g);

  /* check 'fixedgc' list */
  for (o = g->fixedgc; o != NULL; o = o->next) {
    lua_assert(o->tt == LUA_TSHRSTR && isgray(o) && getage(o) == G_OLD);
  }

  /* check 'allgc' list */
  maybedead = (GCSatomic < g->gcstate && g->gcstate <= GCSswpallgc);
  totalshould = checklist(g, maybedead, 0, g->allgc,
                             g->survival, g->old1, g->reallyold);

  /* check 'finobj' list */
  totalshould += checklist(g, 0, 1, g->finobj,
                              g->finobjsur, g->finobjold1, g->finobjrold);

  /* check 'tobefnz' list */
  for (o = g->tobefnz; o != NULL; o = o->next) {
    checkobject(g, o, 0, G_NEW);
    incifingray(g, o, &totalshould);
    lua_assert(tofinalize(o));
    lua_assert(o->tt == LUA_TUSERDATA || o->tt == LUA_TTABLE);
  }
  if (keepinvariant(g))
    lua_assert(totalin == totalshould);
  return 0;
}